

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Utf8ReadLimited(u8 *z,int n,u32 *piOut)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  bVar1 = *z;
  uVar4 = (uint)bVar1;
  if (bVar1 < 0xc0) {
    iVar3 = 1;
  }
  else {
    uVar4 = (uint)""[bVar1 - 0xc0];
    iVar2 = 4;
    if (n < 4) {
      iVar2 = n;
    }
    iVar3 = 1;
    if (1 < iVar2) {
      iVar3 = iVar2;
    }
    for (lVar5 = 1; lVar5 < iVar2; lVar5 = lVar5 + 1) {
      if ((z[lVar5] & 0xffffffc0) != 0x80) {
        iVar3 = (int)lVar5;
        break;
      }
      uVar4 = uVar4 << 6 | z[lVar5] & 0x3f;
    }
  }
  *piOut = uVar4;
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3Utf8ReadLimited(
  const u8 *z,
  int n,
  u32 *piOut
){
  u32 c;
  int i = 1;
  assert( n>0 );
  c = z[0];
  if( c>=0xc0 ){
    c = sqlite3Utf8Trans1[c-0xc0];
    if( n>4 ) n = 4;
    while( i<n && (z[i] & 0xc0)==0x80 ){
      c = (c<<6) + (0x3f & z[i]);
      i++;
    }
  }
  *piOut = c;
  return i;
}